

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-ascii-cursor.c
# Opt level: O2

int coda_ascii_cursor_read_double(coda_cursor_conflict *cursor,double *dst)

{
  ulong uVar1;
  char *pcVar2;
  int *piVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  coda_type *pcVar7;
  size_t __n;
  int iVar8;
  ulong uVar9;
  size_t length;
  int64_t bit_size_boundary;
  char buffer [64];
  
  pcVar7 = (coda_type *)cursor->stack[(long)cursor->n + -1].type;
  if (99 < pcVar7->format) {
    pcVar7 = *(coda_type **)&pcVar7->type_class;
  }
  uVar6 = cursor->stack[(long)cursor->n + -1].bit_offset;
  iVar4 = get_bit_size_boundary(cursor,&bit_size_boundary,pcVar7->bit_size);
  iVar8 = -1;
  if (iVar4 == 0) {
    if ((uVar6 & 7) == 0) {
      uVar1 = pcVar7->bit_size;
      if ((long)uVar1 < 0) {
        length = 0x40;
        if (bit_size_boundary >> 3 < 0x40) {
          length = bit_size_boundary >> 3;
        }
        iVar8 = 1;
      }
      else {
        if (0x207 < uVar1) {
          __assert_fail("buffer_size <= MAX_ASCII_NUMBER_LENGTH",
                        "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-ascii-cursor.c"
                        ,0x523,"int coda_ascii_cursor_read_double(const coda_cursor *, double *)");
        }
        length = uVar1 >> 3;
        iVar8 = 0;
      }
      iVar4 = read_bytes_in_bounds(cursor->product,(long)uVar6 >> 3,length,buffer);
      if (iVar4 == 0) {
        pcVar2 = pcVar7[1].description;
        if (pcVar2 != (char *)0x0) {
          uVar9 = 0;
          uVar6 = (ulong)*(uint *)(pcVar2 + 8);
          if ((int)*(uint *)(pcVar2 + 8) < 1) {
            uVar6 = uVar9;
          }
          for (; uVar6 != uVar9; uVar9 = uVar9 + 1) {
            piVar3 = *(int **)(*(long *)(pcVar2 + 0x10) + uVar9 * 8);
            __n = (size_t)*piVar3;
            if (__n == 0) {
              if (length == 0) goto LAB_001493df;
            }
            else if (((long)__n <= (long)length) &&
                    (iVar4 = bcmp(*(void **)(piVar3 + 2),buffer,__n), iVar4 == 0)) {
              if (((long)uVar1 < 0) || (length == __n)) {
LAB_001493df:
                *dst = *(double *)(piVar3 + 4);
                return 0;
              }
              coda_set_error(-0x67,"invalid format for ascii float");
              goto LAB_00149334;
            }
          }
        }
        lVar5 = coda_ascii_parse_double(buffer,length,dst,iVar8);
        iVar8 = (int)(lVar5 >> 0x3f);
      }
      else {
LAB_00149334:
        iVar8 = -1;
      }
    }
    else {
      coda_set_error(-0x16,"reading of ascii data does not start at byte boundary");
    }
  }
  return iVar8;
}

Assistant:

int coda_ascii_cursor_read_double(const coda_cursor *cursor, double *dst)
{
    coda_type_number *type = (coda_type_number *)coda_get_type_for_dynamic_type(cursor->stack[cursor->n - 1].type);
    int64_t bit_offset = cursor->stack[cursor->n - 1].bit_offset;
    int64_t bit_size_boundary;
    char buffer[MAX_ASCII_NUMBER_LENGTH];
    long buffer_size;
    int has_dynamic_size = 1;

    if (get_bit_size_boundary(cursor, &bit_size_boundary, type->bit_size) != 0)
    {
        return -1;
    }

    if (bit_offset & 0x7)
    {
        coda_set_error(CODA_ERROR_FILE_READ, "reading of ascii data does not start at byte boundary");
        return -1;
    }

    if (type->bit_size >= 0)
    {
        has_dynamic_size = 0;
        buffer_size = (long)(type->bit_size >> 3);
        assert(buffer_size <= MAX_ASCII_NUMBER_LENGTH);
    }
    else if (bit_size_boundary >> 3 < MAX_ASCII_NUMBER_LENGTH)
    {
        buffer_size = (long)(bit_size_boundary >> 3);
    }
    else
    {
        buffer_size = MAX_ASCII_NUMBER_LENGTH;
    }

    if (read_bytes_in_bounds(cursor->product, bit_offset >> 3, buffer_size, buffer) != 0)
    {
        return -1;
    }
    if (type->mappings != NULL)
    {
        switch (parse_float_mapping(buffer, buffer_size, type->mappings, has_dynamic_size, dst))
        {
            case 0:
                /* no mapping applied */
                break;
            case 1:
                /* applicable mapping found */
                return 0;
            default:
                return -1;
        }
    }
    if (coda_ascii_parse_double(buffer, buffer_size, dst, has_dynamic_size) < 0)
    {
        return -1;
    }

    return 0;
}